

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseSafe(Parser *this)

{
  int iVar1;
  Token *pTVar2;
  undefined8 uVar3;
  Parser *in_RSI;
  undefined1 local_70 [32];
  _Base_ptr local_50;
  Position local_48;
  undefined4 local_2c;
  
  pTVar2 = in_RSI->lexer->currentToken;
  local_48.line = (pTVar2->pos).line;
  local_48.startIndex = (pTVar2->pos).startIndex;
  local_48.endIndex = (pTVar2->pos).endIndex;
  sanityExpect(in_RSI,TOK_KW_SAFE);
  parseExpression((Parser *)local_70,(Precedence)in_RSI);
  if ((Lexer *)local_70._0_8_ == (Lexer *)0x0) {
    this->lexer = (Lexer *)0x0;
    return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
  }
  Position::operator+(&local_48,(Position *)&((string *)(local_70._0_8_ + 0x18))->_M_string_length);
  local_48.endIndex = (size_t)local_50;
  iVar1 = *(int *)&(((string *)(local_70._0_8_ + 0x18))->_M_dataplus)._M_p;
  if (iVar1 - 0x15U < 3) {
    std::
    make_unique<pfederc::SafeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              ((Lexer *)(local_70 + 0x10),(Position *)in_RSI->lexer,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_48);
LAB_0010cb5a:
    uVar3 = local_70._16_8_;
    local_70._16_8_ = (Lexer *)0x0;
    this->lexer = (Lexer *)uVar3;
    std::unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)
               (local_70 + 0x10));
  }
  else {
    if (iVar1 == 0x12) {
      if (*(_func_int ***)local_70._0_8_ != (_func_int **)&PTR__BiOpExpr_0012b998) {
LAB_0010cc67:
        __cxa_bad_cast();
      }
      if ((short)((string *)(local_70._0_8_ + 0x38))->_M_string_length == 0x2f) {
        std::
        make_unique<pfederc::SafeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)(local_70 + 0x10),(Position *)in_RSI->lexer,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_48);
        goto LAB_0010cb5a;
      }
    }
    else if (iVar1 == 0x13) {
      if (*(_func_int ***)local_70._0_8_ != (_func_int **)&PTR__UnOpExpr_0012b9c0)
      goto LAB_0010cc67;
      if (*(short *)((((string *)(local_70._0_8_ + 0x38))->_M_dataplus)._M_p + 0x10) == 0x2f) {
        std::
        make_unique<pfederc::SafeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)(local_70 + 0x10),(Position *)in_RSI->lexer,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_48);
        goto LAB_0010cb5a;
      }
    }
    else {
      local_70._14_2_ = 2;
      local_2c = 0x1e;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_70 + 0x10),(SyntaxErrorCode *)(local_70 + 0xe),
                 (Position *)&local_2c);
      generateError((Parser *)&stack0xffffffffffffffd8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffd8);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_70 + 0x10));
    }
    this->lexer = (Lexer *)0x0;
  }
  if ((Lexer *)local_70._0_8_ != (Lexer *)0x0) {
    (*(*(_func_int ***)local_70._0_8_)[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseSafe() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_SAFE);

  std::unique_ptr<Expr> expr(parseExpression());

  if (!expr)
    return nullptr;

  pos = pos + expr->getPosition();

  switch (expr->getType()) {
	case ExprType::EXPR_ARRLIT:
  case ExprType::EXPR_ARRCPY:
  case ExprType::EXPR_ARREMPTY:
    return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
	case ExprType::EXPR_UNOP:
    if (dynamic_cast<const UnOpExpr&>(*expr).getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN)
      return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
    break;
	case ExprType::EXPR_BIOP:
    if (dynamic_cast<const BiOpExpr&>(*expr).getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN)
      return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
    break;
  default:
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CONSTRUCTION,
      expr->getPosition()));
    return nullptr;
  }

  return nullptr;
}